

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controlparser.cpp
# Opt level: O2

void __thiscall ControlParser::parseTimeOfDaySetting(ControlParser *this)

{
  int iVar1;
  InputError *pIVar2;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string strTime;
  string strUnits;
  
  local_60 = (undefined1  [8])&strTime._M_string_length;
  strTime._M_dataplus._M_p = (pointer)0x0;
  strTime._M_string_length._0_1_ = 0;
  std::__cxx11::string::string
            ((string *)(strTime.field_2._M_local_buf + 8),"",(allocator *)&local_80);
  if (((&this->field_0x20)[*(long *)(*(long *)this + -0x18)] & 2) != 0) {
    pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_80);
    InputError::InputError(pIVar2,2,&local_c0);
    __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
  }
  std::operator>>((istream *)this,(string *)local_60);
  if (((&this->field_0x20)[*(long *)(*(long *)this + -0x18)] & 2) == 0) {
    std::operator>>((istream *)this,(string *)(strTime.field_2._M_local_buf + 8));
  }
  iVar1 = Utilities::getSeconds((string *)local_60,(string *)((long)&strTime.field_2 + 8));
  this->timeSetting = iVar1;
  if (-1 < iVar1) {
    this->controlType = 3;
    std::__cxx11::string::~string((string *)(strTime.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_60);
    return;
  }
  pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
  std::operator+(&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60," ");
  std::operator+(&local_a0,&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&strTime.field_2 + 8));
  InputError::InputError(pIVar2,7,&local_a0);
  __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
}

Assistant:

void ControlParser::parseTimeOfDaySetting()
{
    // ... read time of day
    string strTime;
    string strUnits = "";
    if ( sin.eof() ) throw InputError(InputError::TOO_FEW_ITEMS, "");
    sin >> strTime;
    if ( !sin.eof() ) sin >> strUnits;

    // ... convert time of day to seconds
    timeSetting = Utilities::getSeconds(strTime, strUnits);
    if ( timeSetting < 0 )
    {
        throw InputError(InputError::INVALID_TIME, strTime + " " + strUnits);
    }
    controlType = Control::TIME_OF_DAY;
}